

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O2

void __thiscall
helics::TranslatorFederate::TranslatorFederate
          (TranslatorFederate *this,GlobalFederateId fedID,string *name,GlobalBrokerId coreID,
          Core *param_4)

{
  TimeCoordinator *this_00;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  (this->mFedID).gid = fedID.gid;
  (this->mCoreID).gid = coreID.gid;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
  this_00 = &this->mCoord;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/TranslatorFederate.cpp:31:12)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/TranslatorFederate.cpp:31:12)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  TimeCoordinator::TimeCoordinator
            (this_00,(function<void_(const_helics::ActionMessage_&)> *)&local_50);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  this->mHandles = (HandleManager *)0x0;
  this->current_state = CREATED;
  this->usingGlobalTime = false;
  memset(&this->mQueueMessage,0,0xe0);
  (this->minReturnTime).internalTimeCode = 0x7fffffffffffffff;
  (this->translators).dataStorage.
  super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->translators).dataStorage.
  super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->translators).dataStorage.
  super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->translators).lookup._M_h._M_buckets = &(this->translators).lookup._M_h._M_single_bucket;
  (this->translators).lookup._M_h._M_bucket_count = 1;
  (this->translators).lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->translators).lookup._M_h._M_element_count = 0;
  (this->translators).lookup._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->translators).lookup._M_h._M_rehash_policy._M_next_resize = 0;
  (this->translators).lookup._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mCoord).super_BaseTimeCoordinator.mSourceId.gid = fedID.gid;
  TimeCoordinator::setOptionFlag(this_00,0x51,true);
  (this->mCoord).super_BaseTimeCoordinator.nonGranting = true;
  TimeCoordinator::setProperty(this_00,0x96,(Time)0x1);
  return;
}

Assistant:

TranslatorFederate::TranslatorFederate(GlobalFederateId fedID,
                                       std::string name,
                                       GlobalBrokerId coreID,
                                       Core* /*core*/):
    mFedID(fedID), mCoreID(coreID), mName(std::move(name)), /*mCore(core),*/
    mCoord([this](const ActionMessage& msg) { routeMessage(msg); })
{
    mCoord.setSourceId(fedID);
    mCoord.setOptionFlag(helics::defs::Flags::EVENT_TRIGGERED, true);
    mCoord.specifyNonGranting(true);
    mCoord.setProperty(HELICS_PROPERTY_TIME_OUTPUT_DELAY, Time::epsilon());
}